

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O1

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::encode_at_current_rate<bool,bool>
          (RateAdaptiveCode<unsigned_int> *this,vector<bool,_std::allocator<bool>_> *in,
          vector<bool,_std::allocator<bool>_> *out)

{
  pointer pvVar1;
  _Bit_type *p_Var2;
  _Bit_type *p_Var3;
  uint *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint *var_node;
  uint *puVar11;
  ulong uVar12;
  _Bit_type _Var13;
  ulong uVar14;
  
  if ((ulong)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 == this->n_cols) {
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (out,((long)(this->pos_varn).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->pos_varn).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               false);
    pvVar1 = (this->pos_varn).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->pos_varn).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
    if (lVar8 != 0) {
      lVar8 = (lVar8 >> 3) * -0x5555555555555555;
      p_Var2 = (out->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      p_Var3 = (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      uVar7 = 0;
      do {
        puVar11 = pvVar1[uVar7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar4 = *(pointer *)
                  ((long)&pvVar1[uVar7].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (puVar11 != puVar4) {
          uVar14 = uVar7 + 0x3f;
          if (-1 < (long)uVar7) {
            uVar14 = uVar7;
          }
          uVar12 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
          uVar9 = 1L << ((byte)uVar7 & 0x3f);
          bVar5 = (byte)uVar7 & 0x3f;
          _Var13 = p_Var2[((long)uVar14 >> 6) + uVar12 + 0xffffffffffffffff];
          do {
            uVar6 = _Var13 & uVar9;
            uVar10 = _Var13 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            _Var13 = _Var13 | uVar9;
            if ((uVar6 != 0) == ((p_Var3[*puVar11 >> 6] >> ((ulong)*puVar11 & 0x3f) & 1) != 0)) {
              _Var13 = uVar10;
            }
            p_Var2[((long)uVar14 >> 6) + uVar12 + 0xffffffffffffffff] = _Var13;
            puVar11 = puVar11 + 1;
          } while (puVar11 != puVar4);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != lVar8 + (ulong)(lVar8 == 0));
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Encoder received invalid input length.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

constexpr void encode_at_current_rate(
                const std::vector<BitL> &in, std::vector<BitR> &out) const {
            if (in.size() != n_cols) {
                LDPC4QKD_DEBUG_MESSAGE("Encoder received invalid input length.");  // TODO maybe use exception?
                return;
            }

            out.assign(pos_varn.size(), 0);

            for (std::size_t i{}; i < pos_varn.size(); ++i) {
                for (auto &var_node: pos_varn[i]) {
                    out[i] = xor_as_bools(out[i], in[var_node]);
                }
            }
        }